

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

token * multiplicative_expression(dmr_C *C,token *token,expression **tree)

{
  uint val;
  expression *C_00;
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  position pVar5;
  expression *local_58;
  allocator *local_50;
  expression **local_48;
  expression *local_40;
  expression *right;
  
  local_58 = (expression *)0x0;
  local_48 = tree;
  right = (expression *)C;
  ptVar1 = cast_expression(C,token,&local_58);
  if (local_58 == (expression *)0x0) {
    peVar2 = (expression *)0x0;
  }
  else {
    pVar5 = ptVar1->pos;
    peVar2 = local_58;
    if ((pVar5._0_4_ & 0x3f) == 0x11) {
      local_50 = (allocator *)((long)&right[7].field_5 + 0x10);
      peVar4 = local_58;
      do {
        local_40 = (expression *)0x0;
        val = (ptVar1->field_2).argnum;
        peVar2 = peVar4;
        if ((0x2f < (ulong)val) || ((0x842000000000U >> ((ulong)val & 0x3f) & 1) == 0)) break;
        peVar2 = (expression *)dmrC_allocator_allocate(local_50,0);
        *(undefined1 *)peVar2 = 5;
        peVar2->pos = pVar5;
        ptVar1 = cast_expression((dmr_C *)right,ptVar1->next,&local_40);
        C_00 = right;
        if (local_40 == (expression *)0x0) {
          pcVar3 = dmrC_show_special((dmr_C *)right,val);
          dmrC_sparse_error((dmr_C *)C_00,ptVar1->pos,"No right hand side of \'%s\'-expression",
                            pcVar3);
          peVar2 = peVar4;
          break;
        }
        peVar2->field_0x1 =
             (byte)((ushort)*(undefined2 *)peVar4 >> 8) &
             (byte)((ushort)*(undefined2 *)local_40 >> 8) & 1;
        peVar2->op = val;
        (peVar2->field_5).field_3.unop = peVar4;
        (peVar2->field_5).field_2.string = (string *)local_40;
        pVar5 = ptVar1->pos;
        peVar4 = peVar2;
      } while ((pVar5._0_4_ & 0x3f) == 0x11);
    }
  }
  *local_48 = peVar2;
  return ptVar1;
}

Assistant:

static struct token *multiplicative_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C, 
		token, tree, EXPR_BINOP, cast_expression,
		(op == '*') || (op == '/') || (op == '%')
	);
}